

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O3

void flatbuffers::SetAnyValueI(BaseType type,uint8_t *data,int64_t val)

{
  switch(type) {
  case UType:
  case Bool:
  case Byte:
  case UByte:
    *data = (uint8_t)val;
    return;
  case Short:
  case UShort:
    *(short *)data = (short)val;
    return;
  case Int:
  case UInt:
    *(int *)data = (int)val;
    return;
  case Long:
  case ULong:
    *(int64_t *)data = val;
    return;
  case Float:
    *(float *)data = (float)val;
    return;
  case Double:
    *(double *)data = (double)val;
  }
  return;
}

Assistant:

void SetAnyValueI(reflection::BaseType type, uint8_t *data, int64_t val) {
  // clang-format off
  #define FLATBUFFERS_SET(T) WriteScalar(data, static_cast<T>(val))
  switch (type) {
    case reflection::UType:
    case reflection::Bool:
    case reflection::UByte:  FLATBUFFERS_SET(uint8_t ); break;
    case reflection::Byte:   FLATBUFFERS_SET(int8_t  ); break;
    case reflection::Short:  FLATBUFFERS_SET(int16_t ); break;
    case reflection::UShort: FLATBUFFERS_SET(uint16_t); break;
    case reflection::Int:    FLATBUFFERS_SET(int32_t ); break;
    case reflection::UInt:   FLATBUFFERS_SET(uint32_t); break;
    case reflection::Long:   FLATBUFFERS_SET(int64_t ); break;
    case reflection::ULong:  FLATBUFFERS_SET(uint64_t); break;
    case reflection::Float:  FLATBUFFERS_SET(float   ); break;
    case reflection::Double: FLATBUFFERS_SET(double  ); break;
    // TODO: support strings
    default: break;
  }
  #undef FLATBUFFERS_SET
  // clang-format on
}